

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::count(QLatin1StringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QLatin1StringMatcher matcher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&matcher,0xaa,0x220);
  QLatin1StringMatcher::QLatin1StringMatcher(&matcher,needle,cs);
  lVar2 = -1;
  lVar3 = lVar2;
  do {
    lVar2 = QLatin1StringMatcher::indexIn(&matcher,haystack,lVar2 + 1);
    lVar3 = lVar3 + 1;
  } while (lVar2 != -1);
  QLatin1StringMatcher::~QLatin1StringMatcher(&matcher);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar3;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QLatin1StringView haystack, QLatin1StringView needle, Qt::CaseSensitivity cs)
{
    qsizetype num = 0;
    qsizetype i = -1;

    QLatin1StringMatcher matcher(needle, cs);
    while ((i = matcher.indexIn(haystack, i + 1)) != -1)
        ++num;

    return num;
}